

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double birthday_cdf(int n)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  if (n < 1) {
    return 0.0;
  }
  if (0x16d < n) {
    return 1.0;
  }
  dVar3 = 1.0;
  iVar2 = 0x16d;
  do {
    dVar3 = (dVar3 * (double)iVar2) / 365.0;
    iVar1 = n + iVar2;
    iVar2 = iVar2 + -1;
  } while (iVar1 != 0x16e);
  return 1.0 - dVar3;
}

Assistant:

double birthday_cdf ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_CDF returns the Birthday Concurrence CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of people whose birthdays have been
//    disclosed.
//
//    Output, double BIRTHDAY_CDF, the probability that at least
//    two of the N people have matching birthays..
//
{
  double cdf;
  int i;

  if ( n < 1 )
  {
    cdf = 0.0;
    return cdf;
  }
  else if ( 365 < n )
  {
    cdf = 1.0;
    return cdf;
  }
//
//  Compute the probability that N people have distinct birthdays.
//
  cdf = 1.0;
  for ( i = 1; i <= n; i++ )
  {
    cdf = cdf * static_cast<double>(365 + 1 - i ) / 365.0;
  }
//
//  Compute the probability that it is NOT the case that N people
//  have distinct birthdays.  This is the cumulative probability
//  that person 2 matches person 1, or person 3 matches 1 or 2,
//  etc.
//
  cdf = 1.0 - cdf;

  return cdf;
}